

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ATN.hpp
# Opt level: O3

pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
* __thiscall
Centaurus::ATNNode<unsigned_char>::get_entry_exit_wide
          (pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
           *__return_storage_ptr__,ATNNode<unsigned_char> *this,wstring *prefix)

{
  wstring local_58;
  wstring local_38;
  
  if (this->m_type == RegularTerminal) {
    NFABase<Centaurus::NFABaseState<unsigned_char,_int>_>::get_entry_wide
              (&local_58,&(this->m_nfa).super_NFABase<Centaurus::NFABaseState<unsigned_char,_int>_>,
               prefix);
    NFABase<Centaurus::NFABaseState<unsigned_char,_int>_>::get_exit_wide
              (&local_38,&(this->m_nfa).super_NFABase<Centaurus::NFABaseState<unsigned_char,_int>_>,
               prefix);
    std::__cxx11::wstring::wstring((wstring *)__return_storage_ptr__,(wstring *)&local_58);
    std::__cxx11::wstring::wstring((wstring *)&__return_storage_ptr__->second,(wstring *)&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p);
    }
  }
  else {
    std::
    pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
    ::
    pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_true>
              (__return_storage_ptr__,prefix,prefix);
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<std::wstring, std::wstring> get_entry_exit_wide(const std::wstring& prefix) const
	{
		if (m_type == ATNNodeType::RegularTerminal)
		{
			return std::pair<std::wstring, std::wstring>(m_nfa.get_entry_wide(prefix), m_nfa.get_exit_wide(prefix));
		}
		else
		{
			return std::pair<std::wstring, std::wstring>(prefix, prefix);
		}
	}